

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckTypedefs.cxx
# Opt level: O0

string * __thiscall
kws::Parser::FindTypedef_abi_cxx11_
          (Parser *this,size_t start,size_t end,size_t *pos,size_t *beg,size_t *typdefpos)

{
  long lVar1;
  char *pcVar2;
  ulong in_RCX;
  long in_RSI;
  string *in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  long *in_stack_00000008;
  string store;
  bool first;
  bool inWord;
  size_t i;
  string sub;
  size_t posSemicolon;
  size_t posTypedef;
  string *typedefname;
  string local_b8 [38];
  byte local_92;
  byte local_91;
  ulong local_90;
  allocator local_82;
  undefined1 local_81;
  undefined4 local_80;
  allocator local_79;
  string local_78 [32];
  ulong local_58;
  allocator local_39;
  long local_38;
  ulong *local_30;
  ulong *local_28;
  ulong local_20;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_38 = std::__cxx11::string::find((char *)(in_RSI + 0x518),0x1e5b7b);
  if (local_38 == -1) {
    *local_28 = 0xffffffffffffffff;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    *in_stack_00000008 = local_38;
    local_58 = std::__cxx11::string::find((char *)(in_RSI + 0x518),0x1e54be);
    std::__cxx11::string::substr((ulong)local_78,in_RSI + 0x518);
    lVar1 = std::__cxx11::string::find((char *)local_78,0x1e54ca);
    if ((((lVar1 == -1) &&
         (lVar1 = std::__cxx11::string::find((char *)local_78,0x1d797d), lVar1 == -1)) &&
        (lVar1 = std::__cxx11::string::find((char *)local_78,0x1d7c9a), lVar1 == -1)) &&
       (lVar1 = std::__cxx11::string::find((char *)local_78,0x1dce50), lVar1 == -1)) {
      local_81 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",&local_82);
      std::allocator<char>::~allocator((allocator<char> *)&local_82);
      if ((local_58 != 0xffffffffffffffff) && (local_58 < local_20)) {
        local_91 = 1;
        local_92 = 0;
        local_90 = local_58;
        while (local_90 = local_90 - 1, (local_91 & 1) != 0) {
          pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518);
          if (*pcVar2 == ' ') {
            if ((local_92 & 1) != 0) {
              local_91 = 0;
            }
          }
          else {
            std::__cxx11::string::string(local_b8,(string *)in_RDI);
            pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518);
            std::__cxx11::string::operator=((string *)in_RDI,*pcVar2);
            std::__cxx11::string::operator+=((string *)in_RDI,local_b8);
            *local_30 = local_90;
            local_91 = 1;
            local_92 = 1;
            std::__cxx11::string::~string(local_b8);
          }
        }
      }
      *local_28 = local_58;
      local_81 = 1;
    }
    else {
      *local_28 = local_58;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",&local_79);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    local_80 = 1;
    std::__cxx11::string::~string(local_78);
  }
  return in_RDI;
}

Assistant:

std::string Parser::FindTypedef(size_t start, size_t end,size_t & pos,size_t & beg,size_t & typdefpos)
{
  size_t posTypedef  = m_BufferNoComment.find("typedef",start);
  if(posTypedef == std::string::npos)
    {
    pos = std::string::npos;
    return "";
    }

  typdefpos = posTypedef;
  size_t posSemicolon = m_BufferNoComment.find(";",posTypedef);

  // Check if we have any () in the subword then we don't check the typdef
  std::string sub = m_BufferNoComment.substr(posTypedef,posSemicolon-posTypedef);
  if((sub.find("(",0) != std::string::npos)
    || (sub.find(")",0) != std::string::npos)
    || (sub.find("{",0) != std::string::npos)
    || (sub.find("}",0) != std::string::npos)
    )
    {
    pos = posSemicolon;
    return "";
    }

  std::string typedefname = "";
  if(posSemicolon != std::string::npos && posSemicolon<end)
    {
    // We try to find the word before that
    size_t i=posSemicolon-1;
    bool inWord = true;
    bool first = false;
    while(inWord)
      {
      if(m_BufferNoComment[i] != ' ')
        {
        std::string store = typedefname;
        typedefname = m_BufferNoComment[i];
        typedefname += store;
        beg = i;
        inWord = true;
        first = true;
        }
      else // we have a space
        {
        if(first)
          {
          inWord = false;
          }
        }
      i--;
      }
    }

  pos = posSemicolon;
  return typedefname;
}